

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT CreateLibraryByteCode(char *contentsRaw)

{
  uint local_2c;
  JsErrorCode local_28;
  uint i;
  HRESULT hr;
  uint bcBufferSize;
  BYTE *bcBuffer;
  JsValueRef bufferVal;
  char *contentsRaw_local;
  
  _hr = (BYTE *)0x0;
  i = 0;
  bufferVal = contentsRaw;
  local_28 = GetSerializedBuffer(contentsRaw,WScriptJsrt::FinalizeFree,&bcBuffer);
  if ((-1 < (int)local_28) &&
     (local_28 = ChakraRTInterface::JsGetArrayBufferStorage(bcBuffer,(BYTE **)&hr,&i),
     -1 < (int)local_28)) {
    PAL_printf("[] = {\n/* 00000000 */");
    for (local_2c = 0; local_2c < i; local_2c = local_2c + 1) {
      PAL_printf(" 0x%02X",(ulong)_hr[local_2c]);
      if (local_2c < i - 1) {
        PAL_printf(",");
      }
      if (((local_2c & 0xf) == 0xf) && (local_2c < i - 1)) {
        PAL_printf("\n/* %08X */",(ulong)(local_2c + 1));
      }
    }
    PAL_printf("};\n\n");
    local_28 = JsNoError;
  }
  return local_28;
}

Assistant:

HRESULT CreateLibraryByteCode(const char* contentsRaw)
{
    JsValueRef bufferVal;
    BYTE *bcBuffer = nullptr;
    unsigned int bcBufferSize = 0;
    HRESULT hr = E_FAIL;
    
    // Windows can't do the below with printf - so use windows API on windows but printf on posix
    #ifdef _WIN32
        HANDLE out = GetStdHandle(STD_OUTPUT_HANDLE);
        DWORD written = 0;
        #define print_format(format, element, size) \
        { \
            auto scratchLen = size; \
            char scratch[size]; \
            int len = _snprintf_s(scratch, scratchLen, _countof(scratch), format, element); \
            IfFalseGo(WriteFile(out, scratch, (DWORD)(len), &written, nullptr)); \
        }
        #define print(text) \
            WriteFile(out, text, (DWORD)strlen(text), &written, nullptr);
    #else
        #define print_format(format, element, size) printf(format, element)
        #define print printf
    #endif

    // Generate the bytecode, free the original buffer then retrieve the generated bytecode
    IfFailGo(GetSerializedBuffer(contentsRaw, WScriptJsrt::FinalizeFree, &bufferVal));
    IfFailGo(ChakraRTInterface::JsGetArrayBufferStorage(bufferVal, &bcBuffer, &bcBufferSize));

    // Write out the bytecode
    print("[] = {\n/* 00000000 */");

    for (unsigned int i = 0; i < bcBufferSize; i++)
    {
        print_format(" 0x%02X", bcBuffer[i], 6);
        // Add a comma if this is not the last item
        if (i < bcBufferSize - 1)
        {
            print(",");
        }

        // Add a line break every 16 scratches, primarily so the compiler doesn't complain about the string being too long.
        // Also, won't add for the last scratch
        if (i % 16 == 15 && i < bcBufferSize - 1)
        {
            print_format("\n/* %08X */", i + 1, 17);
        }
    }
    print("};\n\n");

    #undef print
    #undef print_format

    hr = S_OK;

Error:
    return hr;
}